

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

_outconnect * linetraverser_next(t_linetraverser *t)

{
  int iVar1;
  int iVar2;
  _outconnect *p_Var3;
  int local_50;
  int local_4c;
  int iom;
  int iow;
  int outplus;
  int inplus;
  t_object *ob;
  t_gobj *y;
  _outconnect *p_Stack_20;
  int outno;
  _outconnect *rval;
  t_linetraverser *t_local;
  
  p_Stack_20 = t->tr_nextoc;
  do {
    if (p_Stack_20 != (_outconnect *)0x0) {
      p_Var3 = obj_nexttraverseoutlet(p_Stack_20,&t->tr_ob2,&t->tr_inlet,&t->tr_inno);
      t->tr_nextoc = p_Var3;
      iVar1 = obj_ninlets(t->tr_ob2);
      t->tr_nin = iVar1;
      if (t->tr_nin == 0) {
        bug("drawline");
      }
      iVar1 = glist_isvisible(t->tr_x);
      if (iVar1 == 0) {
        t->tr_y22 = 0;
        t->tr_x22 = 0;
        t->tr_y21 = 0;
        t->tr_x21 = 0;
        t->tr_ly2 = 0;
        t->tr_lx2 = 0;
        t->tr_ly1 = 0;
        t->tr_lx1 = 0;
      }
      else {
        if (t->tr_nin == 1) {
          local_4c = 1;
        }
        else {
          local_4c = t->tr_nin + -1;
        }
        if (t->tr_nout == 1) {
          local_50 = 1;
        }
        else {
          local_50 = t->tr_nout + -1;
        }
        iVar1 = t->tr_x->gl_zoom;
        iVar2 = t->tr_x->gl_zoom * 3;
        gobj_getrect(&t->tr_ob2->te_g,t->tr_x,&t->tr_x21,&t->tr_y21,&t->tr_x22,&t->tr_y22);
        t->tr_lx1 = t->tr_x11 + (((t->tr_x12 - t->tr_x11) + iVar1 * -7) * t->tr_outno) / local_50 +
                    iVar2;
        t->tr_ly1 = t->tr_y12;
        t->tr_lx2 = t->tr_x21 + (((t->tr_x22 - t->tr_x21) + iVar1 * -7) * t->tr_inno) / local_4c +
                    iVar2;
        t->tr_ly2 = t->tr_y21;
      }
      return p_Stack_20;
    }
    y._4_4_ = t->tr_nextoutno;
    while (y._4_4_ == t->tr_nout) {
      _outplus = (t_object *)0x0;
      if (t->tr_ob == (t_object *)0x0) {
        ob = (t_object *)t->tr_x->gl_list;
      }
      else {
        ob = (t_object *)(t->tr_ob->te_g).g_next;
      }
      while ((ob != (t_object *)0x0 &&
             (_outplus = pd_checkobject((t_pd *)ob), _outplus == (t_object *)0x0))) {
        ob = (t_object *)(ob->te_g).g_next;
      }
      if (_outplus == (t_object *)0x0) {
        return (_outconnect *)0x0;
      }
      t->tr_ob = _outplus;
      iVar1 = obj_noutlets(_outplus);
      t->tr_nout = iVar1;
      y._4_4_ = 0;
      iVar1 = glist_isvisible(t->tr_x);
      if (iVar1 == 0) {
        t->tr_y12 = 0;
        t->tr_x12 = 0;
        t->tr_y11 = 0;
        t->tr_x11 = 0;
      }
      else {
        gobj_getrect(&ob->te_g,t->tr_x,&t->tr_x11,&t->tr_y11,&t->tr_x12,&t->tr_y12);
      }
    }
    t->tr_nextoutno = y._4_4_ + 1;
    p_Stack_20 = obj_starttraverseoutlet(t->tr_ob,&t->tr_outlet,y._4_4_);
    t->tr_outno = y._4_4_;
  } while( true );
}

Assistant:

t_outconnect *linetraverser_next(t_linetraverser *t)
{
    t_outconnect *rval = t->tr_nextoc;
    int outno;
    while (!rval)
    {
        outno = t->tr_nextoutno;
        while (outno == t->tr_nout)
        {
            t_gobj *y;
            t_object *ob = 0;
            if (!t->tr_ob) y = t->tr_x->gl_list;
            else y = t->tr_ob->ob_g.g_next;
            for (; y; y = y->g_next)
                if ((ob = pd_checkobject(&y->g_pd))) break;
            if (!ob) return (0);
            t->tr_ob = ob;
            t->tr_nout = obj_noutlets(ob);
            outno = 0;
            if (glist_isvisible(t->tr_x))
                gobj_getrect(y, t->tr_x,
                    &t->tr_x11, &t->tr_y11, &t->tr_x12, &t->tr_y12);
            else t->tr_x11 = t->tr_y11 = t->tr_x12 = t->tr_y12 = 0;
        }
        t->tr_nextoutno = outno + 1;
        rval = obj_starttraverseoutlet(t->tr_ob, &t->tr_outlet, outno);
        t->tr_outno = outno;
    }
    t->tr_nextoc = obj_nexttraverseoutlet(rval, &t->tr_ob2,
        &t->tr_inlet, &t->tr_inno);
    t->tr_nin = obj_ninlets(t->tr_ob2);
    if (!t->tr_nin) bug("drawline");
    if (glist_isvisible(t->tr_x))
    {
        int inplus = (t->tr_nin == 1 ? 1 : t->tr_nin - 1);
        int outplus = (t->tr_nout == 1 ? 1 : t->tr_nout - 1);
        int iow = IOWIDTH * t->tr_x->gl_zoom;
        int iom = IOMIDDLE * t->tr_x->gl_zoom;
        gobj_getrect(&t->tr_ob2->ob_g, t->tr_x,
            &t->tr_x21, &t->tr_y21, &t->tr_x22, &t->tr_y22);
        t->tr_lx1 = t->tr_x11 +
            ((t->tr_x12 - t->tr_x11 - iow) * t->tr_outno) /
                outplus + iom;
        t->tr_ly1 = t->tr_y12;
        t->tr_lx2 = t->tr_x21 +
            ((t->tr_x22 - t->tr_x21 - iow) * t->tr_inno)/inplus +
                iom;
        t->tr_ly2 = t->tr_y21;
    }
    else
    {
        t->tr_x21 = t->tr_y21 = t->tr_x22 = t->tr_y22 = 0;
        t->tr_lx1 = t->tr_ly1 = t->tr_lx2 = t->tr_ly2 = 0;
    }

    return (rval);
}